

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O2

LArNESTResult * __thiscall
NEST::LArNEST::FullCalculation
          (LArNESTResult *__return_storage_ptr__,LArNEST *this,LArInteraction species,double energy,
          double dx,double efield,double density,bool do_times)

{
  long lVar1;
  LArNEST *this_00;
  LArNESTResult *pLVar2;
  byte bVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined1 local_58 [24];
  double dStack_40;
  
  bVar3 = 0;
  if (density < 1.0) {
    ((this->super_NESTcalc).fdetector)->inGas = true;
  }
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->photon_times).super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetYields((LArYieldResult *)local_58,this,species,energy,dx,efield,density);
  this_00 = (LArNEST *)local_58;
  pLVar2 = __return_storage_ptr__;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pLVar2->yields).TotalYield = (double)(this_00->super_NESTcalc)._vptr_NESTcalc;
    this_00 = (LArNEST *)((long)this_00 + (ulong)bVar3 * -0x10 + 8);
    pLVar2 = (LArNESTResult *)((long)pLVar2 + (ulong)bVar3 * -0x10 + 8);
  }
  GetDefaultFluctuations
            ((LArYieldFluctuationResult *)local_58,this_00,&__return_storage_ptr__->yields,
             (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  (__return_storage_ptr__->fluctuations).NexFluctuation = (double)local_58._16_8_;
  (__return_storage_ptr__->fluctuations).NionFluctuation = dStack_40;
  (__return_storage_ptr__->fluctuations).NphFluctuation = (double)local_58._0_8_;
  (__return_storage_ptr__->fluctuations).NeFluctuation = (double)local_58._8_8_;
  return __return_storage_ptr__;
}

Assistant:

LArNESTResult LArNEST::FullCalculation(LArInteraction species, double energy,
                                       double dx, double efield, double density,
                                       bool do_times) {
  if (density < 1.) fdetector->set_inGas(true);
  LArNESTResult result;
  result.yields = GetYields(species, energy, dx, efield, density);
  result.fluctuations = GetYieldFluctuations(species, result.yields, density);
  // if (do_times)
  //     result.photon_times = GetPhotonTimes(
  //         species, result.quanta.photons,
  //         result.quanta.excitons, efield, energy
  //     );
  // else {
  //     result.photon_times = photonstream(result.quanta.photons, 0.0);
  // }
  return result;
}